

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

char * jx9_value_to_string(jx9_value *pValue,int *pLen)

{
  sxu32 sVar1;
  sxi32 sVar2;
  char *pcVar3;
  
  jx9MemObjToString(pValue);
  if ((pValue->sBlob).nByte == 0) {
    pcVar3 = "";
    if (pLen != (int *)0x0) {
      *pLen = 0;
    }
  }
  else {
    sVar1 = (pValue->sBlob).nByte;
    sVar2 = SyBlobAppend(&pValue->sBlob,"",1);
    if (sVar2 == 0) {
      (pValue->sBlob).nByte = sVar1;
    }
    if (pLen != (int *)0x0) {
      *pLen = (pValue->sBlob).nByte;
    }
    pcVar3 = (char *)(pValue->sBlob).pBlob;
  }
  return pcVar3;
}

Assistant:

JX9_PRIVATE const char * jx9_value_to_string(jx9_value *pValue, int *pLen)
{
	jx9MemObjToString(pValue);
	if( SyBlobLength(&pValue->sBlob) > 0 ){
		SyBlobNullAppend(&pValue->sBlob);
		if( pLen ){
			*pLen = (int)SyBlobLength(&pValue->sBlob);
		}
		return (const char *)SyBlobData(&pValue->sBlob);
	}else{
		/* Return the empty string */
		if( pLen ){
			*pLen = 0;
		}
		return "";
	}
}